

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall Transaction_CommitInt_Test::TestBody(Transaction_CommitInt_Test *this)

{
  bool bVar1;
  shared_ptr<pstore::file::in_memory> *file;
  header *rhs;
  value_type vVar2;
  value_type vVar3;
  Message *pMVar4;
  char *pcVar5;
  element_type_conflict2 *peVar6;
  unsigned_long uVar7;
  __shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  element_type *peVar9;
  AssertHelper local_498;
  Message local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_15;
  int *r1data;
  Message local_468;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_14;
  Message local_448;
  ContainerEqMatcher<std::array<unsigned_char,_8UL>_> local_440;
  StlContainer local_438;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_13;
  Message local_418;
  typed_address<pstore::trailer> local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_12;
  Message local_3f0;
  unsigned_long local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_11;
  Message local_3c8;
  uint local_3bc;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_10;
  Message local_3a0;
  ContainerEqMatcher<std::array<unsigned_char,_8UL>_> local_398;
  StlContainer local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_9;
  trailer *r1footer;
  Message local_368;
  ContainerEqMatcher<std::array<unsigned_char,_8UL>_> local_360;
  StlContainer local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_8;
  Message local_338;
  typed_address<pstore::trailer> local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_7;
  Message local_310;
  uint local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_6;
  Message local_2e8;
  uint local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_5;
  Message local_2c0;
  ContainerEqMatcher<std::array<unsigned_char,_8UL>_> local_2b8;
  StlContainer local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_4;
  trailer *r0footer;
  Message local_288;
  typed_address<pstore::trailer> local_280;
  value_type local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  ContainerEqMatcher<std::array<unsigned_char,_4UL>_> local_250;
  StlContainer local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  Message local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_1;
  value_type local_210;
  uint64_t g1footer_offset;
  uint64_t r1contents_offset;
  uint64_t new_header_offset;
  AssertHelper local_1f0;
  Message local_1e8;
  ulong local_1e0;
  uint local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> rw;
  undefined1 local_198 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mock_mutex mutex;
  typed_address<pstore::trailer> tStack_158;
  int data_value;
  uint64_t r0footer_offset;
  header *header;
  database db;
  Transaction_CommitInt_Test *this_local;
  
  db.sync_name_.field_2._8_8_ = this;
  file = in_memory_store::file(&(this->super_Transaction).store_);
  pstore::database::database<pstore::file::in_memory>((database *)&header,file,true);
  pstore::database::set_vacuum_mode((database *)&header,disabled);
  rhs = anon_unknown.dwarf_2883f3::Transaction::get_header(&this->super_Transaction);
  tStack_158 = std::atomic<pstore::typed_address<pstore::trailer>_>::load
                         (&rhs->footer_pos,memory_order_seq_cst);
  vVar2 = pstore::typed_address<pstore::trailer>::absolute(&stack0xfffffffffffffea8);
  transaction.lock_._12_4_ = 0x7fed;
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&rw.second,(mutex_type *)&transaction.lock_.field_0xb);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_198,(database *)&header,
          (unique_lock<mock_mutex> *)&rw.second);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&rw.second);
  pstore::transaction_base::alloc_rw<int,void>
            ((pair<std::shared_ptr<int>,_pstore::typed_address<int>_> *)&gtest_ar.message_,
             (transaction_base *)local_198,1);
  local_1d4 = 0;
  vVar3 = pstore::typed_address<int>::absolute
                    ((typed_address<int> *)
                     &rw.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1e0 = (ulong)((uint)vVar3 & 3);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1d0,"0U","rw.second.absolute () % alignof (int)",&local_1d4,
             &local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pMVar4 = testing::Message::operator<<
                       (&local_1e8,(char (*) [45])"The address must be suitably aligned for int");
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x8e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1f0,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  new_header_offset._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  if (new_header_offset._4_4_ == 0) {
    peVar6 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &gtest_ar.message_);
    *peVar6 = 0x7fed;
    new_header_offset._4_4_ = 0;
  }
  std::pair<std::shared_ptr<int>,_pstore::typed_address<int>_>::~pair
            ((pair<std::shared_ptr<int>,_pstore::typed_address<int>_> *)&gtest_ar.message_);
  if (new_header_offset._4_4_ == 0) {
    pstore::transaction_base::commit((transaction_base *)local_198);
    new_header_offset._4_4_ = 0;
  }
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_198);
  if (new_header_offset._4_4_ == 0) {
    r1contents_offset = 0xb0;
    uVar7 = pstore::calc_alignment<unsigned_long>(0xb0,4);
    g1footer_offset = r1contents_offset + uVar7;
    r1contents_offset = g1footer_offset + 4;
    uVar7 = pstore::calc_alignment<unsigned_long>(r1contents_offset,8);
    r1contents_offset = r1contents_offset + uVar7;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::atomic<pstore::typed_address<pstore::trailer>_>::load
                     (&rhs->footer_pos,memory_order_seq_cst);
    local_210 = pstore::typed_address<pstore::trailer>::absolute
                          ((typed_address<pstore::trailer> *)&gtest_ar_1.message_);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_228,"new_header_offset","g1footer_offset",&r1contents_offset,
               &local_210);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
    if (!bVar1) {
      testing::Message::Message(&local_230);
      pMVar4 = testing::Message::operator<<
                         (&local_230,(char (*) [36])"Expected offset of r1 footer to be ");
      pMVar4 = testing::Message::operator<<(pMVar4,&r1contents_offset);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0x9e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_230);
    }
    new_header_offset._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
    if (new_header_offset._4_4_ == 0) {
      local_250.expected_._M_elems =
           (StlContainer)
           testing::ContainerEq<std::array<unsigned_char,4ul>>((array<unsigned_char,_4UL> *)rhs);
      local_24c._M_elems =
           (_Type)testing::internal::
                  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,4ul>>>>
                            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_4UL>_>_>
                              )local_250.expected_._M_elems);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,4ul>>>>
      ::operator()(local_248,(char *)&local_24c,
                   (array<unsigned_char,_4UL> *)"pstore::header::file_signature1");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar1) {
        testing::Message::Message(&local_258);
        pMVar4 = testing::Message::operator<<(&local_258,(char (*) [24])"File header was missing");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xa3,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_258);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      local_280 = std::atomic<pstore::typed_address<pstore::trailer>_>::load
                            (&rhs->footer_pos,memory_order_seq_cst);
      local_278 = pstore::typed_address<pstore::trailer>::absolute(&local_280);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_270,"g1footer_offset","header->footer_pos.load ().absolute ()",
                 &local_210,&local_278);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
      if (!bVar1) {
        testing::Message::Message(&local_288);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&r0footer,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xa5,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&r0footer,&local_288);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&r0footer);
        testing::Message::~Message(&local_288);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
      p_Var8 = &in_memory_store::buffer(&(this->super_Transaction).store_)->
                super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
      peVar9 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get(p_Var8);
      gtest_ar_4.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)peVar9 + vVar2);
      local_2b8.expected_._M_elems =
           (StlContainer)
           testing::ContainerEq<std::array<unsigned_char,8ul>>
                     ((array<unsigned_char,_8UL> *)
                      gtest_ar_4.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
      local_2b0._M_elems =
           (_Type)testing::internal::
                  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
                            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_8UL>_>_>
                              )local_2b8.expected_._M_elems);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
      ::operator()(local_2a8,(char *)&local_2b0,
                   (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
      if (!bVar1) {
        testing::Message::Message(&local_2c0);
        pMVar4 = testing::Message::operator<<
                           (&local_2c0,(char (*) [38])"Did not find the r0 footer signature1");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xac,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_2c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
      local_2dc = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_std::atomic<unsigned_int>,_nullptr>
                ((EqHelper *)local_2d8,"0U","r0footer->a.generation",&local_2dc,
                 (atomic<unsigned_int> *)
                 ((long)gtest_ar_4.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 8));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
      if (!bVar1) {
        testing::Message::Message(&local_2e8);
        pMVar4 = testing::Message::operator<<
                           (&local_2e8,(char (*) [38])"r0 footer generation number must be 0");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xae,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_2e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
      local_304 = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_std::atomic<unsigned_long>,_nullptr>
                ((EqHelper *)local_300,"0U","r0footer->a.size",&local_304,
                 (atomic<unsigned_long> *)
                 ((long)gtest_ar_4.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x10));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
      if (!bVar1) {
        testing::Message::Message(&local_310);
        pMVar4 = testing::Message::operator<<
                           (&local_310,(char (*) [42])"expected the r0 footer size value to be 0");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xaf,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_310);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
      local_330 = pstore::typed_address<pstore::trailer>::null();
      testing::internal::EqHelper::
      Compare<pstore::typed_address<pstore::trailer>,_pstore::typed_address<pstore::trailer>,_nullptr>
                ((EqHelper *)local_328,"pstore::typed_address<pstore::trailer>::null ()",
                 "r0footer->a.prev_generation",&local_330,
                 (typed_address<pstore::trailer> *)
                 ((long)gtest_ar_4.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x20));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
      if (!bVar1) {
        testing::Message::Message(&local_338);
        pMVar4 = testing::Message::operator<<
                           (&local_338,
                            (char (*) [56])"The r0 footer should not point to a previous generation"
                           );
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xb0,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_338);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
      local_360.expected_._M_elems =
           (StlContainer)
           testing::ContainerEq<std::array<unsigned_char,8ul>>
                     ((array<unsigned_char,_8UL> *)
                      ((long)gtest_ar_4.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 0x68));
      local_358._M_elems =
           (_Type)testing::internal::
                  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
                            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_8UL>_>_>
                              )local_360.expected_._M_elems);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
      ::operator()(local_350,(char *)&local_358,
                   (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
      if (!bVar1) {
        testing::Message::Message(&local_368);
        pMVar4 = testing::Message::operator<<
                           (&local_368,(char (*) [34])"Did not find r0 footer signature2");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&r1footer,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xb3,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&r1footer,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&r1footer);
        testing::Message::~Message(&local_368);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
      p_Var8 = &in_memory_store::buffer(&(this->super_Transaction).store_)->
                super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
      peVar9 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get(p_Var8);
      gtest_ar_9.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)peVar9 + local_210);
      local_398.expected_._M_elems =
           (StlContainer)
           testing::ContainerEq<std::array<unsigned_char,8ul>>
                     ((array<unsigned_char,_8UL> *)
                      gtest_ar_9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
      local_390._M_elems =
           (_Type)testing::internal::
                  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
                            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_8UL>_>_>
                              )local_398.expected_._M_elems);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
      ::operator()(local_388,(char *)&local_390,
                   (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
      if (!bVar1) {
        testing::Message::Message(&local_3a0);
        pMVar4 = testing::Message::operator<<
                           (&local_3a0,(char (*) [38])"Did not find the r1 footer signature1");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xb9,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
        testing::Message::~Message(&local_3a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
      local_3bc = 1;
      testing::internal::EqHelper::Compare<unsigned_int,_std::atomic<unsigned_int>,_nullptr>
                ((EqHelper *)local_3b8,"1U","r1footer->a.generation",&local_3bc,
                 (atomic<unsigned_int> *)
                 ((long)gtest_ar_9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 8));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
      if (!bVar1) {
        testing::Message::Message(&local_3c8);
        pMVar4 = testing::Message::operator<<
                           (&local_3c8,(char (*) [38])"r1 footer generation number must be 1");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xbb,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
        testing::Message::~Message(&local_3c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
      local_3e8 = 4;
      testing::internal::CmpHelperGE<std::atomic<unsigned_long>,unsigned_long>
                ((internal *)local_3e0,"r1footer->a.size","sizeof (int)",
                 (atomic<unsigned_long> *)
                 ((long)gtest_ar_9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x10),&local_3e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
      if (!bVar1) {
        testing::Message::Message(&local_3f0);
        pMVar4 = testing::Message::operator<<
                           (&local_3f0,(char (*) [44])"r1 footer size must be at least sizeof (int")
        ;
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xbc,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
        testing::Message::~Message(&local_3f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
      local_410 = pstore::typed_address<pstore::trailer>::make(0x40);
      testing::internal::EqHelper::
      Compare<pstore::typed_address<pstore::trailer>,_pstore::typed_address<pstore::trailer>,_nullptr>
                ((EqHelper *)local_408,
                 "pstore::typed_address<pstore::trailer>::make (pstore::leader_size)",
                 "r1footer->a.prev_generation",&local_410,
                 (typed_address<pstore::trailer> *)
                 ((long)gtest_ar_9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x20));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
      if (!bVar1) {
        testing::Message::Message(&local_418);
        pMVar4 = testing::Message::operator<<
                           (&local_418,(char (*) [44])"r1 previous pointer must point to r0 footer")
        ;
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xbe,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
        testing::Message::~Message(&local_418);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
      local_440.expected_._M_elems =
           (StlContainer)
           testing::ContainerEq<std::array<unsigned_char,8ul>>
                     ((array<unsigned_char,_8UL> *)
                      ((long)gtest_ar_9.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 0x68));
      local_438._M_elems =
           (_Type)testing::internal::
                  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
                            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,_8UL>_>_>
                              )local_440.expected_._M_elems);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
      ::operator()(local_430,(char *)&local_438,
                   (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
      if (!bVar1) {
        testing::Message::Message(&local_448);
        pMVar4 = testing::Message::operator<<
                           (&local_448,(char (*) [34])"Did not find r1 footer signature2");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xc1,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
        testing::Message::~Message(&local_448);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
      testing::internal::CmpHelperGE<std::atomic<unsigned_long>,std::atomic<unsigned_long>>
                ((internal *)local_460,"r1footer->a.time","r0footer->a.time",
                 (atomic<unsigned_long> *)
                 ((long)gtest_ar_9.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x18),
                 (atomic<unsigned_long> *)
                 ((long)gtest_ar_4.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x18));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
      if (!bVar1) {
        testing::Message::Message(&local_468);
        pMVar4 = testing::Message::operator<<
                           (&local_468,(char (*) [41])"r1 time must not be earlier than r0 time");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&r1data,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xc4,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&r1data,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&r1data);
        testing::Message::~Message(&local_468);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
      p_Var8 = &in_memory_store::buffer(&(this->super_Transaction).store_)->
                super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
      peVar9 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get(p_Var8);
      gtest_ar_15.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)peVar9 + g1footer_offset);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_488,"data_value","*r1data",(int *)&transaction.lock_.field_0xc,
                 (int *)gtest_ar_15.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
      if (!bVar1) {
        testing::Message::Message(&local_490);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
        testing::internal::AssertHelper::AssertHelper
                  (&local_498,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                   ,0xcb,pcVar5);
        testing::internal::AssertHelper::operator=(&local_498,&local_490);
        testing::internal::AssertHelper::~AssertHelper(&local_498);
        testing::Message::~Message(&local_490);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
      new_header_offset._4_4_ = 0;
    }
  }
  pstore::database::~database((database *)&header);
  return;
}

Assistant:

TEST_F (Transaction, CommitInt) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    auto header = this->get_header ();
    std::uint64_t const r0footer_offset = header->footer_pos.load ().absolute ();

    int const data_value = 32749;

    // Scope for the single transaction that we'll commit for the test.
    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
        {
            // Write an integer to the store.
            // If rw is a spanning pointer, it will only be saved to the store when it is deleted.
            // TODO: write a large vector (>4K) so the 'protect' function, which is called by the
            // transaction commit function, has an effect.
            std::pair<std::shared_ptr<int>, pstore::typed_address<int>> rw =
                transaction.alloc_rw<int> ();
            ASSERT_EQ (0U, rw.second.absolute () % alignof (int))
                << "The address must be suitably aligned for int";
            *(rw.first) = data_value;
        }

        transaction.commit ();
    }

    std::uint64_t new_header_offset = pstore::leader_size;
    new_header_offset += sizeof (pstore::trailer);
    new_header_offset += pstore::calc_alignment (new_header_offset, alignof (int));
    std::uint64_t const r1contents_offset = new_header_offset;
    new_header_offset += sizeof (int);
    new_header_offset += pstore::calc_alignment (new_header_offset, alignof (pstore::trailer));

    std::uint64_t const g1footer_offset = header->footer_pos.load ().absolute ();
    ASSERT_EQ (new_header_offset, g1footer_offset)
        << "Expected offset of r1 footer to be " << new_header_offset;


    // Header checks.
    EXPECT_THAT (pstore::header::file_signature1, ::testing::ContainerEq (header->a.signature1))
        << "File header was missing";
    EXPECT_EQ (g1footer_offset, header->footer_pos.load ().absolute ());

    // Check the two footers.
    {
        auto r0footer =
            reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () + r0footer_offset);
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r0footer->a.signature1))
            << "Did not find the r0 footer signature1";
        EXPECT_EQ (0U, r0footer->a.generation) << "r0 footer generation number must be 0";
        EXPECT_EQ (0U, r0footer->a.size) << "expected the r0 footer size value to be 0";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), r0footer->a.prev_generation)
            << "The r0 footer should not point to a previous generation";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r0footer->signature2))
            << "Did not find r0 footer signature2";

        auto r1footer =
            reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () + g1footer_offset);
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r1footer->a.signature1))
            << "Did not find the r1 footer signature1";
        EXPECT_EQ (1U, r1footer->a.generation) << "r1 footer generation number must be 1";
        EXPECT_GE (r1footer->a.size, sizeof (int)) << "r1 footer size must be at least sizeof (int";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::make (pstore::leader_size),
                   r1footer->a.prev_generation)
            << "r1 previous pointer must point to r0 footer";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r1footer->signature2))
            << "Did not find r1 footer signature2";

        EXPECT_GE (r1footer->a.time, r0footer->a.time)
            << "r1 time must not be earlier than r0 time";
    }

    // Finally check the r1 contents
    {
        auto r1data = reinterpret_cast<int const *> (store_.buffer ().get () + r1contents_offset);
        EXPECT_EQ (data_value, *r1data);
    }
}